

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O0

void Gia_ManInseInit(Gia_Man_t *p,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  bool bVar4;
  int local_38;
  int local_34;
  int k;
  int i;
  word *pData0;
  word *pData1;
  Gia_Obj_t *pObj;
  Vec_Int_t *vInit_local;
  Gia_Man_t *p_local;
  
  local_38 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar4 = false;
    if (local_38 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pData1 = (word *)Gia_ManCo(p,iVar1 + local_38);
      bVar4 = (Gia_Obj_t *)pData1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)pData1);
    pwVar3 = Gia_ParTestObj(p,iVar1);
    iVar1 = p->iData;
    iVar2 = Vec_IntEntry(vInit,local_38);
    if (iVar2 == 0) {
      for (local_34 = 0; local_34 < p->iData; local_34 = local_34 + 1) {
        pwVar3[local_34] = 0xffffffffffffffff;
        pwVar3[(long)iVar1 + (long)local_34] = 0;
      }
    }
    else {
      iVar2 = Vec_IntEntry(vInit,local_38);
      if (iVar2 == 1) {
        for (local_34 = 0; local_34 < p->iData; local_34 = local_34 + 1) {
          pwVar3[local_34] = 0;
          pwVar3[(long)iVar1 + (long)local_34] = 0xffffffffffffffff;
        }
      }
      else {
        for (local_34 = 0; local_34 < p->iData; local_34 = local_34 + 1) {
          pwVar3[(long)iVar1 + (long)local_34] = 0;
          pwVar3[local_34] = 0;
        }
      }
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void Gia_ManInseInit( Gia_Man_t * p, Vec_Int_t * vInit )
{
    Gia_Obj_t * pObj;
    word * pData1, * pData0;
    int i, k;
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        if ( Vec_IntEntry(vInit, k) == 0 ) // 0
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = ~(word)0, pData1[i] = 0;
        else if ( Vec_IntEntry(vInit, k) == 1 ) // 1
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = 0, pData1[i] = ~(word)0;
        else // if ( Vec_IntEntry(vInit, k) > 1 ) // X
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = pData1[i] = 0;
    }
}